

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O2

Global * wasm::getStackPointerGlobal(Module *wasm)

{
  pointer puVar1;
  Global *pGVar2;
  iterator __begin1;
  pointer puVar3;
  pointer puVar4;
  
  puVar3 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar3;
  while( true ) {
    if (puVar4 == puVar1) {
      do {
        if (puVar3 == puVar1) {
          return (Global *)0x0;
        }
        pGVar2 = (puVar3->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        puVar3 = puVar3 + 1;
      } while (*(char **)((long)&(pGVar2->super_Importable).module + 8) != (char *)0x0);
      return pGVar2;
    }
    pGVar2 = (puVar4->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if ((*(char **)((long)&(pGVar2->super_Importable).module + 8) != (char *)0x0) &&
       (*(char **)((long)&(pGVar2->super_Importable).base + 8) == (char *)STACK_POINTER._8_8_))
    break;
    puVar4 = puVar4 + 1;
  }
  return pGVar2;
}

Assistant:

Global* getStackPointerGlobal(Module& wasm) {
  // Assumption: The stack pointer is either imported as __stack_pointer or
  // we just assume it's the first non-imported global.
  // TODO(sbc): Find a better way to discover the stack pointer.  Perhaps the
  // linker could export it by name?
  for (auto& g : wasm.globals) {
    if (g->imported() && g->base == STACK_POINTER) {
      return g.get();
    }
  }
  for (auto& g : wasm.globals) {
    if (!g->imported()) {
      return g.get();
    }
  }
  return nullptr;
}